

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

QString * QtMWidgets::accomodateString
                    (QString *__return_storage_ptr__,QString *text,QRect *r,int flags,
                    QStyleOption *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar4;
  int iVar5;
  QArrayDataPointer<char16_t> local_68;
  QRect *local_50;
  QString tmp;
  
  local_50 = (QRect *)(opt + 0x20);
  iVar5 = (int)r;
  iVar2 = QFontMetrics::boundingRect
                    (local_50,iVar5,(QString *)(ulong)(uint)flags,(int)text,(int *)0x0);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&text->d);
  if ((r->x2 - r->x1) + 1 < (extraout_EDX - iVar2) + 1) {
    QString::clear(__return_storage_ptr__);
    for (iVar2 = 0; iVar2 <= ((r->x2 - r->x1) + 1) / 2; iVar2 = (extraout_EDX_00 - iVar2) + 1) {
      QString::append((QChar)(char16_t)__return_storage_ptr__);
      iVar2 = QFontMetrics::boundingRect
                        (local_50,iVar5,(QString *)(ulong)(uint)flags,(int)__return_storage_ptr__,
                         (int *)0x0);
    }
    tmp.d.d = (Data *)0x0;
    tmp.d.ptr = L"...";
    tmp.d.size = 3;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    QString::append(__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&tmp.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    lVar4 = ((text->d).size << 0x20) + -0x100000000;
    QString::QString(&tmp,(QChar)*(char16_t *)((long)(text->d).ptr + (lVar4 >> 0x1f)));
    lVar4 = (lVar4 >> 0x20) * 2;
    while( true ) {
      lVar4 = lVar4 + -2;
      operator+((QString *)&local_68,__return_storage_ptr__,&tmp);
      iVar3 = QFontMetrics::boundingRect
                        (local_50,iVar5,(QString *)(ulong)(uint)flags,(int)&local_68,(int *)0x0);
      iVar2 = r->x2;
      iVar1 = r->x1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if ((iVar2 - iVar1) + 1 < (extraout_EDX_01 - iVar3) + 1) break;
      QString::prepend(&tmp,(QChar)*(char16_t *)((long)(text->d).ptr + lVar4));
    }
    QString::right((longlong)&local_68);
    QString::append(__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&tmp.d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString
accomodateString( const QString & text, const QRect & r,
	int flags, const QStyleOption & opt )
{
	const QRect & b = opt.fontMetrics.boundingRect( r, flags, text );

	QString res = text;

	if( b.width() > r.width() )
	{
		int w = 0;
		int x = 0;

		res.clear();

		while( w <= ( r.width() ) / 2 )
		{
			res.append( text.at( x ) );
			++x;
			w = opt.fontMetrics.boundingRect( r, flags, res ).width();
		}

		res.append( QStringLiteral( "..." ) );

		x = text.length() - 1;

		QString tmp = text.at( x );

		while( opt.fontMetrics.boundingRect( r, flags, res + tmp ).width() <= r.width() )
		{
			--x;
			tmp.prepend( text.at( x ) );
		}

		res.append( text.right( text.length() - x - 1 ) );
	}

	return res;
}